

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
::find_or_prepare_insert_soo<upb_MiniTable_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
          *this,upb_MiniTable **key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  slot_type *ppuVar4;
  size_t i;
  uint64_t v;
  bool bVar5;
  iterator iVar6;
  
  if (*(ulong *)(this + 8) < 2) {
    if (*(long *)this != 1) {
      if (*(long *)this == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                     );
      }
      __assert_fail("is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdc5,
                    "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                   );
    }
    CommonFields::AssertInSooMode((CommonFields *)this);
    *(undefined8 *)(this + 8) = 2;
    aVar3.slot_ = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                  ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                              *)this);
    bVar5 = true;
    iVar6.field_1.slot_ = aVar3.slot_;
    iVar6.ctrl_ = (ctrl_t *)&kSooControl;
  }
  else {
    ppuVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
              ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                          *)this);
    if (*ppuVar4 == *key) {
      aVar3.slot_ = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                                *)this);
      iVar6.field_1.slot_ = aVar3.slot_;
      iVar6.ctrl_ = (ctrl_t *)&kSooControl;
      bVar5 = false;
    }
    else {
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
      ::resize_impl(this,3);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)&(*key)->subs_dont_copy_me__upb_internal_use_only +
                     (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                     SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
      i = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                    (SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0),8,(CommonFields *)this);
      iVar6 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
              ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                             *)this,i);
      bVar5 = true;
    }
  }
  __return_storage_ptr__->first = iVar6;
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }